

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O1

void TTD::NSSnapType::ParseSnapType
               (SnapType *sType,bool readSeparator,FileReader *reader,SlabAllocator *alloc,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>
               *typeHandlerMap)

{
  TypeId TVar1;
  int iVar2;
  TTD_PTR_ID TVar3;
  TTD_LOG_PTR_ID TVar4;
  TTDVar pvVar5;
  Entry *pEVar6;
  undefined7 in_register_00000031;
  SnapHandler *pSVar7;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000031,readSeparator));
  pSVar7 = (SnapHandler *)0x0;
  TVar3 = FileReader::ReadAddr(reader,typeId,false);
  sType->TypePtrId = TVar3;
  (*reader->_vptr_FileReader[3])(reader,0x20,1);
  TVar1 = (*reader->_vptr_FileReader[0x12])(reader,0);
  sType->JsTypeId = TVar1;
  TVar4 = FileReader::ReadLogTag(reader,ctxTag,true);
  sType->ScriptContextLogId = TVar4;
  (*reader->_vptr_FileReader[3])(reader,0x29,1);
  pvVar5 = NSSnapValues::ParseTTDVar(false,reader);
  sType->PrototypeVar = pvVar5;
  TVar3 = FileReader::ReadAddr(reader,handlerId,true);
  if (TVar3 != 0) {
    pEVar6 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::
             FindSlotForId<false>(typeHandlerMap,TVar3);
    pSVar7 = pEVar6->Data;
  }
  sType->TypeHandlerInfo = pSVar7;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  sType->HasNoEnumerableProperties = SUB41(iVar2,0);
  (*reader->_vptr_FileReader[7])(reader);
  return;
}

Assistant:

void ParseSnapType(SnapType* sType, bool readSeparator, FileReader* reader, SlabAllocator& alloc, const TTDIdentifierDictionary<TTD_PTR_ID, SnapHandler*>& typeHandlerMap)
        {
            reader->ReadRecordStart(readSeparator);

            sType->TypePtrId = reader->ReadAddr(NSTokens::Key::typeId);

            sType->JsTypeId = reader->ReadTag<Js::TypeId>(NSTokens::Key::jsTypeId, true);
            sType->ScriptContextLogId = reader->ReadLogTag(NSTokens::Key::ctxTag, true);

            reader->ReadKey(NSTokens::Key::prototypeVar, true);
            sType->PrototypeVar = NSSnapValues::ParseTTDVar(false, reader);

            TTD_PTR_ID handlerId = reader->ReadAddr(NSTokens::Key::handlerId, true);
            if(handlerId == TTD_INVALID_PTR_ID)
            {
                sType->TypeHandlerInfo = nullptr;
            }
            else
            {
                sType->TypeHandlerInfo = typeHandlerMap.LookupKnownItem(handlerId);
            }

            sType->HasNoEnumerableProperties = reader->ReadBool(NSTokens::Key::boolVal, true);

            reader->ReadRecordEnd();
        }